

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateByteSize
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "{\n  size_t data_size = 0;\n  unsigned int count = static_cast<unsigned int>(this->_internal_$name$_size());"
            );
  Formatter::Indent((Formatter *)local_50);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "for (unsigned int i = 0; i < count; i++) {\n  data_size += ::$proto_ns$::internal::WireFormatLite::EnumSize(\n    this->_internal_$name$(static_cast<int>(i)));\n}\n"
            );
  bVar1 = FieldDescriptor::is_packed((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "if (data_size > 0) {\n  total_size += $tag_size$ +\n    ::$proto_ns$::internal::WireFormatLite::Int32Size(\n        static_cast<$int32$>(data_size));\n}\nint cached_size = ::$proto_ns$::internal::ToCachedSize(data_size);\n_$name$_cached_byte_size_.store(cached_size,\n                                std::memory_order_relaxed);\ntotal_size += data_size;\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,"total_size += ($tag_size$UL * count) + data_size;\n");
  }
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"}\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateByteSize(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "{\n"
      "  size_t data_size = 0;\n"
      "  unsigned int count = static_cast<unsigned "
      "int>(this->_internal_$name$_size());");
  format.Indent();
  format(
      "for (unsigned int i = 0; i < count; i++) {\n"
      "  data_size += ::$proto_ns$::internal::WireFormatLite::EnumSize(\n"
      "    this->_internal_$name$(static_cast<int>(i)));\n"
      "}\n");

  if (descriptor_->is_packed()) {
    format(
        "if (data_size > 0) {\n"
        "  total_size += $tag_size$ +\n"
        "    ::$proto_ns$::internal::WireFormatLite::Int32Size(\n"
        "        static_cast<$int32$>(data_size));\n"
        "}\n"
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(data_size);\n"
        "_$name$_cached_byte_size_.store(cached_size,\n"
        "                                std::memory_order_relaxed);\n"
        "total_size += data_size;\n");
  } else {
    format("total_size += ($tag_size$UL * count) + data_size;\n");
  }
  format.Outdent();
  format("}\n");
}